

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

size_t __thiscall
OpenMesh::
PropertyT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
::restore(PropertyT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
          *this,istream *_istr,bool _swap)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  
  lVar1 = (**(code **)(*(long *)this + 0x58))();
  if (lVar1 == 0) {
    sVar5 = 0;
  }
  else {
    uVar4 = 0;
    sVar5 = 0;
    do {
      sVar2 = IO::
              binary<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
              ::restore(_istr,(this->data_).
                              super__Vector_base<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>,_std::allocator<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar4,_swap);
      sVar5 = sVar5 + sVar2;
      uVar4 = uVar4 + 1;
      uVar3 = (**(code **)(*(long *)this + 0x58))(this);
    } while (uVar4 < uVar3);
  }
  return sVar5;
}

Assistant:

virtual size_t restore( std::istream& _istr, bool _swap )
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::restore(_istr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::restore( _istr, data_[i], _swap );
    return bytes;
  }